

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O2

void __thiscall
QGestureManager::cleanupGesturesForRemovedRecognizer(QGestureManager *this,QGesture *gesture)

{
  QHash<QGesture*,QGestureRecognizer*> *this_00;
  long in_FS_OFFSET;
  QGestureRecognizer *recognizer;
  QArrayDataPointer<QGesture_*> QStack_48;
  QGestureRecognizer *local_30;
  QGesture *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHash<QGesture*,QGestureRecognizer*> *)(this + 0x58);
  local_28 = gesture;
  local_30 = QHash<QGesture_*,_QGestureRecognizer_*>::value
                       ((QHash<QGesture_*,_QGestureRecognizer_*> *)this_00,&local_28);
  if (local_30 != (QGestureRecognizer *)0x0) {
    QHash<QGesture*,QGestureRecognizer*>::removeImpl<QGesture*>(this_00,&local_28);
    QHash<QGesture_*,_QGestureRecognizer_*>::keys
              ((QList<QGesture_*> *)&QStack_48,(QHash<QGesture_*,_QGestureRecognizer_*> *)this_00,
               &local_30);
    QArrayDataPointer<QGesture_*>::~QArrayDataPointer(&QStack_48);
    if (QStack_48.size == 0) {
      QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::value
                ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)&QStack_48,
                 (QGestureRecognizer **)(this + 0x50));
      qDeleteAll<QSet<QGesture*>>((QSet<QGesture_*> *)&QStack_48);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&QStack_48);
      QHash<QGestureRecognizer*,QSet<QGesture*>>::removeImpl<QGestureRecognizer*>
                ((QHash<QGestureRecognizer*,QSet<QGesture*>> *)(this + 0x50),&local_30);
      if (local_30 != (QGestureRecognizer *)0x0) {
        (*local_30->_vptr_QGestureRecognizer[1])();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGestureManager::cleanupGesturesForRemovedRecognizer(QGesture *gesture)
{
    QGestureRecognizer *recognizer = m_deletedRecognizers.value(gesture);
    if (!recognizer) //The Gesture is removed while in the even loop, so the recognizers for this gestures was removed
        return;
    m_deletedRecognizers.remove(gesture);
    if (m_deletedRecognizers.keys(recognizer).isEmpty()) {
        // no more active gestures, cleanup!
        qDeleteAll(m_obsoleteGestures.value(recognizer));
        m_obsoleteGestures.remove(recognizer);
        delete recognizer;
    }
}